

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerSafe::
RequestToken(std::function<void(std::vector<unsigned_char,std::allocator<unsigned_char>>const*,ot::commissioner::Error)>,std::__cxx11::string_const&,unsigned_short)
::$_0::__0(__0 *this,anon_class_80_4_b999da52 *param_1)

{
  anon_class_80_4_b999da52 *param_1_local;
  anon_class_80_4_b999da52 *this_local;
  
  *(CommissionerSafe **)this = param_1->this;
  std::
  function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
  ::function((function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
              *)(this + 8),&param_1->aHandler);
  std::__cxx11::string::string((string *)(this + 0x28),(string *)&param_1->aAddr);
  *(uint16_t *)(this + 0x48) = param_1->aPort;
  return;
}

Assistant:

Error CommissionerSafe::RequestToken(ByteArray &aSignedToken, const std::string &aAddr, uint16_t aPort)
{
    std::promise<Error> pro;
    auto                wait = [&pro, &aSignedToken](const ByteArray *signedToken, Error error) {
        if (signedToken != nullptr)
        {
            aSignedToken = *signedToken;
        }
        pro.set_value(error);
    };

    RequestToken(wait, aAddr, aPort);
    return pro.get_future().get();
}